

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemsave.c
# Opt level: O2

LispPTR vmem_save0(LispPTR *args)

{
  uint uVar1;
  int iVar2;
  __uid_t _Var3;
  LispPTR LVar4;
  LispPTR *pLVar5;
  long lVar6;
  char *__src;
  passwd *ppVar7;
  size_t sVar8;
  long lVar9;
  DLword *pDVar10;
  char host [255];
  char sysout [4096];
  char pathname [4096];
  char acStack_2118 [256];
  char local_2018 [8];
  char acStack_2010 [8];
  undefined1 auStack_2008 [4080];
  char local_1018 [4104];
  
  Lisp_errno = &Dummy_errno;
  if ((*args == 0) || (iVar2 = lispstringP(*args), iVar2 == 0)) {
    __src = getenv("LDEDESTSYSOUT");
    if (__src == (char *)0x0) {
      _Var3 = getuid();
      ppVar7 = getpwuid(_Var3);
      if (ppVar7 == (passwd *)0x0) {
        return 0xe0006;
      }
      strcpy(local_2018,ppVar7->pw_dir);
      sVar8 = strlen(local_2018);
      builtin_strncpy(local_2018 + sVar8,"/lisp.vi",8);
      builtin_strncpy(acStack_2010 + sVar8,"rtualmem",8);
      auStack_2008[sVar8] = 0;
    }
    else if ((*__src == '~') && ((__src[1] == '/' || (__src[1] == '\0')))) {
      _Var3 = getuid();
      ppVar7 = getpwuid(_Var3);
      if (ppVar7 == (passwd *)0x0) {
        return 0xe0006;
      }
      strcpy(local_2018,ppVar7->pw_dir);
      strcat(local_2018,__src + 1);
    }
    else {
      strcpy(local_2018,__src);
    }
  }
  else {
    pLVar5 = NativeAligned4FromLAddr(*args);
    LVar4 = 0x1000;
    if ((int)pLVar5[2] < 0x1000) {
      LVar4 = pLVar5[2];
    }
    lVar9 = (long)(int)LVar4;
    if (*(char *)((long)pLVar5 + 6) == 'D') {
      pDVar10 = Lisp_world + (ulong)(ushort)pLVar5[1] + (ulong)(*pLVar5 & 0xfffffff);
      for (lVar6 = 0; lVar9 != lVar6; lVar6 = lVar6 + 1) {
        local_1018[lVar6] = *(char *)((ulong)pDVar10 ^ 2);
        pDVar10 = pDVar10 + 1;
      }
      local_1018[lVar6] = '\0';
    }
    else if (*(char *)((long)pLVar5 + 6) == 'C') {
      uVar1 = *pLVar5;
      LVar4 = pLVar5[1];
      for (lVar6 = 0; lVar9 != lVar6; lVar6 = lVar6 + 1) {
        local_1018[lVar6] =
             *(char *)((long)Lisp_world +
                       lVar6 + (ulong)(ushort)LVar4 + (ulong)(uVar1 & 0xfffffff) * 2 ^ 3);
      }
      local_1018[lVar9] = '\0';
    }
    else {
      error("LispStringToCString: Not a character array.\n");
    }
    separate_host(local_1018,acStack_2118);
    iVar2 = unixpathname(local_1018,local_2018,0,0);
    if (iVar2 == 0) {
      return 0xe0001;
    }
  }
  LVar4 = vmem_save(local_2018);
  return LVar4;
}

Assistant:

LispPTR vmem_save0(LispPTR *args)
{
  char *def;
  char pathname[MAXPATHLEN], sysout[MAXPATHLEN], host[MAXNAMLEN];
#ifdef DOS
  char pwd[MAXNAMLEN];
  char drive[1];
#else
  struct passwd *pwd;
#endif /* DOS */

  Lisp_errno = &Dummy_errno;

  if ((args[0] != NIL) && lispstringP(args[0])) {
    /* Check of lispstringP is safer for LispStringToCString */
    LispStringToCString(args[0], pathname, MAXPATHLEN);
    separate_host(pathname, host);
#ifdef DOS
    if (!unixpathname(pathname, sysout, 0, 0, drive, 0, 0)) return (BADFILENAME);
#else
    if (!unixpathname(pathname, sysout, 0, 0)) return (BADFILENAME);
#endif /* DOS */
    return (vmem_save(sysout));
  } else {
    if ((def = getenv("LDEDESTSYSOUT")) == 0) {
#ifdef DOS
      if (getcwd(pwd, MAXNAMLEN) == NULL) return (FILETIMEOUT);
      strcpy(sysout, pwd);
      strcat(sysout, "/lisp.vm");
#else
      pwd = getpwuid(getuid()); /* NEED TIMEOUT */
      if (pwd == (struct passwd *)NULL) return (FILETIMEOUT);
      strcpy(sysout, pwd->pw_dir);
      strcat(sysout, "/lisp.virtualmem");
#endif /* DOS */
    } else {
      if (*def == '~' && (*(def + 1) == '/' || *(def + 1) == '\0')) {
#ifdef DOS
        if (getcwd(pwd, MAXNAMLEN) == NULL) return (FILETIMEOUT);
        strcpy(sysout, pwd);
#else
        pwd = getpwuid(getuid()); /* NEED TIMEOUT */
        if (pwd == (struct passwd *)NULL) return (FILETIMEOUT);
        strcpy(sysout, pwd->pw_dir);
#endif /* DOS */
        strcat(sysout, def + 1);
      } else {
        strcpy(sysout, def);
      }
    }
    return (vmem_save(sysout));
  }
}